

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::convertToByteQueue
          (ConstantValue *__return_storage_ptr__,ConstantValue *this,bool isSigned)

{
  bool bVar1;
  string *psVar2;
  reference pcVar3;
  SVInt local_128;
  char local_111;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_110;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  SVQueue queue;
  ConstantValue local_98;
  string local_70;
  string local_40 [8];
  string result;
  bool isSigned_local;
  ConstantValue *this_local;
  
  result.field_2._M_local_buf[0xf] = isSigned;
  bVar1 = isQueue(this);
  if (bVar1) {
    ConstantValue(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string(local_40);
  bVar1 = isInteger(this);
  if (bVar1) {
    convertToStr(&local_98,this);
    str_abi_cxx11_(&local_70,&local_98);
    std::__cxx11::string::operator=(local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    ~ConstantValue(&local_98);
  }
  else {
    bVar1 = isString(this);
    if (!bVar1) {
      ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
      queue._84_4_ = 1;
      goto LAB_001fb180;
    }
    psVar2 = str_abi_cxx11_(this);
    std::__cxx11::string::operator=(local_40,(string *)psVar2);
  }
  SVQueue::SVQueue((SVQueue *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_110._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffef0), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_111 = *pcVar3;
    SVInt::SVInt(&local_128,8,(long)local_111,(bool)(result.field_2._M_local_buf[0xf] & 1));
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
    emplace_back<slang::SVInt>
              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&__range1,
               &local_128);
    SVInt::~SVInt(&local_128);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  ConstantValue(__return_storage_ptr__,(SVQueue *)&__range1);
  queue._84_4_ = 1;
  SVQueue::~SVQueue((SVQueue *)&__range1);
LAB_001fb180:
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::convertToByteQueue(bool isSigned) const {
    if (isQueue())
        return *this;

    std::string result;
    if (isInteger())
        result = convertToStr().str();
    else if (isString())
        result = str();
    else
        return nullptr;

    SVQueue queue;
    for (auto ch : result)
        queue.emplace_back(SVInt(8, static_cast<uint64_t>(ch), isSigned));

    return queue;
}